

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CurlHandle.cpp
# Opt level: O0

int __thiscall
curlpp::internal::CurlHandle::executeDebugFunctor
          (CurlHandle *this,curl_infotype info,char *buffer,size_t size)

{
  bool bVar1;
  CallbackExceptionBase *e_00;
  CurlHandle *in_RDI;
  CallbackExceptionBase *e;
  LogicError *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  undefined8 in_stack_ffffffffffffff88;
  Parm1 p1;
  char *in_stack_ffffffffffffffc8;
  LogicError *in_stack_ffffffffffffffd0;
  undefined4 local_4;
  
  p1 = (Parm1)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  bVar1 = utilspp::
          Functor<int,_utilspp::tl::TypeList<curl_infotype,_utilspp::tl::TypeList<char_*,_utilspp::tl::TypeList<unsigned_long,_utilspp::NullType>_>_>_>
          ::operator!((Functor<int,_utilspp::tl::TypeList<curl_infotype,_utilspp::tl::TypeList<char_*,_utilspp::tl::TypeList<unsigned_long,_utilspp::NullType>_>_>_>
                       *)0x14e580);
  if (bVar1) {
    e_00 = (CallbackExceptionBase *)operator_new(0x20);
    LogicError::LogicError(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    CallbackException<curlpp::LogicError>::CallbackException
              ((CallbackException<curlpp::LogicError> *)
               CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               in_stack_ffffffffffffff78);
    setException(in_RDI,e_00);
    LogicError::~LogicError((LogicError *)0x14e5df);
    local_4 = 0x2a;
  }
  else {
    local_4 = utilspp::
              Functor<int,_utilspp::tl::TypeList<curl_infotype,_utilspp::tl::TypeList<char_*,_utilspp::tl::TypeList<unsigned_long,_utilspp::NullType>_>_>_>
              ::operator()((Functor<int,_utilspp::tl::TypeList<curl_infotype,_utilspp::tl::TypeList<char_*,_utilspp::tl::TypeList<unsigned_long,_utilspp::NullType>_>_>_>
                            *)in_RDI,p1,
                           (Parm2)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                           (Parm3)in_stack_ffffffffffffff78);
  }
  return local_4;
}

Assistant:

int 
CurlHandle::executeDebugFunctor(curl_infotype info, char * buffer, size_t size)
{
	if (!mDebugFunctor)
	{
		setException(new CallbackException<curlpp::LogicError>(curlpp::LogicError("Null write functor")));
		return CURLE_ABORTED_BY_CALLBACK;
	}

	try
	{
		return mDebugFunctor(info, buffer, size);
	}

	catch(curlpp::CallbackExceptionBase * e)
	{
		setException(e);
	}

	catch(...)
	{
		setException(new CallbackException<curlpp::UnknowException>(curlpp::UnknowException()));
	}

	return CURLE_ABORTED_BY_CALLBACK;
}